

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(int lhs,SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  int ret;
  int local_28;
  int local_24;
  unsigned_long local_20;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  
  local_28 = 0;
  local_24 = lhs;
  local_20 = rhs.m_int;
  DivisionHelper<int,_unsigned_long,_3>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_24,&local_20,&local_28);
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_18,&local_28);
  return (SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         local_18.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}